

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O0

void __thiscall CExtPubKey::Decode(CExtPubKey *this,uchar *code)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  CPubKey *pend;
  CPubKey *in_stack_ffffffffffffffb0;
  CPubKey *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((array<unsigned_char,_32UL> *)in_RDI->vch)->_M_elems[4] = *in_RSI;
  *(undefined4 *)(((array<unsigned_char,_32UL> *)in_RDI->vch)->_M_elems + 5) =
       *(undefined4 *)(in_RSI + 1);
  pend = in_RDI;
  uVar3 = ReadBE32(in_RSI);
  *(uint32_t *)(((array<unsigned_char,_32UL> *)in_RDI->vch)->_M_elems + 0xc) = uVar3;
  puVar4 = base_blob<256U>::begin((base_blob<256U> *)in_RDI);
  *(undefined8 *)puVar4 = *(undefined8 *)(in_RSI + 9);
  *(undefined8 *)(puVar4 + 8) = *(undefined8 *)(in_RSI + 0x11);
  *(undefined8 *)(puVar4 + 0x10) = *(undefined8 *)(in_RSI + 0x19);
  *(undefined8 *)(puVar4 + 0x18) = *(undefined8 *)(in_RSI + 0x21);
  CPubKey::Set<unsigned_char_const*>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0->vch,pend->vch);
  if (((array<unsigned_char,_32UL> *)in_RDI->vch)->_M_elems[4] == '\0') {
    if (*(int *)(((array<unsigned_char,_32UL> *)in_RDI->vch)->_M_elems + 0xc) == 0) {
      uVar3 = ReadLE32(in_RSI);
      if (uVar3 == 0) goto LAB_01018d68;
    }
  }
  else {
LAB_01018d68:
    bVar2 = CPubKey::IsFullyValid(in_stack_ffffffffffffffb0);
    if (bVar2) goto LAB_01018d9a;
  }
  CPubKey::CPubKey(in_RDI);
  memcpy(in_RDI->vch + 0x30,&stack0xffffffffffffffb7,0x41);
LAB_01018d9a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CExtPubKey::Decode(const unsigned char code[BIP32_EXTKEY_SIZE]) {
    nDepth = code[0];
    memcpy(vchFingerprint, code+1, 4);
    nChild = ReadBE32(code+5);
    memcpy(chaincode.begin(), code+9, 32);
    pubkey.Set(code+41, code+BIP32_EXTKEY_SIZE);
    if ((nDepth == 0 && (nChild != 0 || ReadLE32(vchFingerprint) != 0)) || !pubkey.IsFullyValid()) pubkey = CPubKey();
}